

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O3

void __thiscall PyreNet::Layer::Layer(Layer *this,int size,int prevSize,Activation *activation)

{
  int local_2c [2];
  int prevSize_local;
  
  (this->nodes).super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c[0] = prevSize;
  std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::reserve
            (&this->nodes,(long)size);
  if (0 < size) {
    do {
      std::vector<PyreNet::Perceptron,std::allocator<PyreNet::Perceptron>>::emplace_back<int_const&>
                ((vector<PyreNet::Perceptron,std::allocator<PyreNet::Perceptron>> *)this,local_2c);
      size = size + -1;
    } while (size != 0);
  }
  this->activation = activation;
  return;
}

Assistant:

Layer::Layer(const int size, const int prevSize, Activation *activation) {
        this->nodes.reserve(size);
        for (int i = 0; i < size; i++) {
            this->nodes.emplace_back(prevSize);
        }
        this->activation = activation;
    }